

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall
SQCompilation::CheckerVisitor::checkVariableMismatchForLoop(CheckerVisitor *this,ForStatement *loop)

{
  Node *pNVar1;
  Node *n;
  _func_int **pp_Var2;
  long lVar3;
  int iVar4;
  VarDecl *decl;
  BinExpr *bin;
  _func_int **pp_Var5;
  
  if (this->effectsOnly != false) {
    return;
  }
  pNVar1 = loop->_init;
  n = &loop->_cond->super_Node;
  if (pNVar1 == (Node *)0x0) {
    pp_Var5 = (_func_int **)0x0;
  }
  else {
    if ((pNVar1->_op == TO_ASSIGN) &&
       (pp_Var5 = pNVar1[1].super_ArenaObj._vptr_ArenaObj, *(int *)(pp_Var5 + 3) == 0x11)) {
      pp_Var5 = (_func_int **)pp_Var5[4];
    }
    else {
      pp_Var5 = (_func_int **)0x0;
    }
    if (pNVar1->_op == TO_VAR) {
      pp_Var5 = pNVar1[1].super_ArenaObj._vptr_ArenaObj;
    }
  }
  pNVar1 = &loop->_mod->super_Node;
  if ((((n != (Node *)0x0) && (pp_Var5 != (_func_int **)0x0)) && (n->_op - TO_OROR < 0x16)) &&
     (pp_Var2 = n[1].super_ArenaObj._vptr_ArenaObj, *(int *)(pp_Var2 + 3) == 0x11)) {
    lVar3 = *(long *)&n[1]._coordinates;
    iVar4 = strcmp((char *)pp_Var2[4],(char *)pp_Var5);
    if ((iVar4 != 0) &&
       ((*(int *)(lVar3 + 0x18) != 0x11 ||
        (iVar4 = strcmp(*(char **)(lVar3 + 0x20),(char *)pp_Var5), iVar4 != 0)))) {
      report(this,n,0x75);
    }
  }
  if ((pNVar1 != (Node *)0x0) && (pp_Var5 != (_func_int **)0x0)) {
    if (((pNVar1->_op - TO_PLUSEQ < 5) || (pNVar1->_op == TO_ASSIGN)) &&
       ((pp_Var2 = pNVar1[1].super_ArenaObj._vptr_ArenaObj, *(int *)(pp_Var2 + 3) == 0x11 &&
        (iVar4 = strcmp((char *)pp_Var5,(char *)pp_Var2[4]), iVar4 != 0)))) {
      report(this,pNVar1,0x75);
    }
    if (((pNVar1->_op == TO_INC) && (*(int *)(*(long *)&pNVar1[1]._coordinates + 0x18) == 0x11)) &&
       (iVar4 = strcmp((char *)pp_Var5,*(char **)(*(long *)&pNVar1[1]._coordinates + 0x20)),
       iVar4 != 0)) {
      report(this,pNVar1,0x75);
      return;
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkVariableMismatchForLoop(ForStatement *loop) {

  if (effectsOnly)
    return;

  const SQChar *varname = nullptr;
  Node *init = loop->initializer();
  Expr *cond = loop->condition();
  Expr *mod = loop->modifier();

  if (init) {
    if (init->op() == TO_ASSIGN) {
      Expr *l = static_cast<BinExpr *>(init)->lhs();
      if (l->op() == TO_ID)
        varname = l->asId()->id();
    }

    if (init->op() == TO_VAR) {
      VarDecl *decl = static_cast<VarDecl *>(init);
      varname = decl->name();
    }
  }

  if (varname && cond) {
    if (isBinaryArith(cond)) {
      BinExpr *bin = static_cast<BinExpr *>(cond);
      Expr *l = bin->lhs();
      Expr *r = bin->rhs();

      if (l->op() == TO_ID) {
        if (strcmp(l->asId()->id(), varname) != 0) {
          if (r->op() != TO_ID || (strcmp(r->asId()->id(), varname) != 0)) {
            report(cond, DiagnosticsId::DI_MISMATCH_LOOP_VAR);
          }
        }
      }
    }
  }

  if (varname && mod) {
    if (isAssignExpr(mod)) {
      Expr *lhs = static_cast<BinExpr *>(mod)->lhs();
      if (lhs->op() == TO_ID) {
        if (strcmp(varname, lhs->asId()->id()) != 0) {
          report(mod, DiagnosticsId::DI_MISMATCH_LOOP_VAR);
        }
      }
    }

    if (mod->op() == TO_INC) {
      Expr *arg = static_cast<IncExpr *>(mod)->argument();
      if (arg->op() == TO_ID) {
        if (strcmp(varname, arg->asId()->id()) != 0) {
          report(mod, DiagnosticsId::DI_MISMATCH_LOOP_VAR);
        }
      }
    }
  }
}